

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureStorageMultisampleTexStorage2DMultisampleTests.cpp
# Opt level: O2

IterateResult __thiscall
glcts::MultisampleTextureTexStorage2DUnsupportedSamplesCountForDepthTexturesTest::iterate
          (MultisampleTextureTexStorage2DUnsupportedSamplesCountForDepthTexturesTest *this)

{
  undefined4 uVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  long lVar5;
  TestError *this_00;
  long lVar6;
  GLint gl_max_internalformat_samples_value;
  undefined4 local_48;
  uint local_44;
  GLint gl_max_samples_value;
  GLint gl_max_depth_texture_samples_value;
  long local_38;
  long lVar4;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  gl_max_depth_texture_samples_value = -1;
  gl_max_internalformat_samples_value = -1;
  gl_max_samples_value = -1;
  lVar5 = 0;
  do {
    if (lVar5 == 3) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
      return STOP;
    }
    local_48 = (&DAT_01744ee4)[lVar5];
    local_38 = lVar5;
    for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
      local_44 = (uint)(byte)(&DAT_01744ef0)[lVar6];
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])(this);
      (**(code **)(lVar4 + 0x868))(0x8d57,&gl_max_samples_value);
      dVar3 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar3,"Failed to retrieve GL_MAX_SAMPLES value",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage2DMultisampleTests.cpp"
                      ,0x3c4);
      (**(code **)(lVar4 + 0x868))(0x910f,&gl_max_depth_texture_samples_value);
      dVar3 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar3,"Failed to retrieve GL_MAX_DEPTH_TEXTURE_SAMPLES value",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage2DMultisampleTests.cpp"
                      ,0x3c9);
      uVar1 = local_48;
      (**(code **)(lVar4 + 0x880))(0x9100,local_48,0x80a9,1,&gl_max_internalformat_samples_value);
      dVar3 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar3,"glGetInternalformativ() failed to retrieve GL_SAMPLES",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage2DMultisampleTests.cpp"
                      ,0x3ce);
      (**(code **)(lVar4 + 0x1390))
                (0x9100,gl_max_internalformat_samples_value + 1,uVar1,1,1,local_44);
      iVar2 = (**(code **)(lVar4 + 0x800))();
      if (iVar2 != 0x502) {
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,
                   "glTexStorage2DMultisample() did not generate GL_INVALID_OPERATION error.",
                   "gl.getError() == GL_INVALID_OPERATION",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage2DMultisampleTests.cpp"
                   ,0x3d6);
        __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])(this);
    }
    lVar5 = local_38 + 1;
  } while( true );
}

Assistant:

tcu::TestNode::IterateResult MultisampleTextureTexStorage2DUnsupportedSamplesCountForDepthTexturesTest::iterate()
{
	/* Test case variables */
	const glw::GLboolean fixedsamplelocations_list[] = { GL_FALSE, GL_TRUE };
	const int			 fixedsamplelocations_list_count =
		sizeof(fixedsamplelocations_list) / sizeof(fixedsamplelocations_list[0]);
	const glw::Functions& gl								  = m_context.getRenderContext().getFunctions();
	glw::GLint			  gl_max_depth_texture_samples_value  = -1; /* Will be determined later */
	glw::GLint			  gl_max_internalformat_samples_value = -1; /* Will be determined later */
	glw::GLint			  gl_max_samples_value				  = -1; /* Will be determined later */
	const glw::GLsizei	height							  = 1;
	const glw::GLenum	 internalformat_list[] = { GL_DEPTH_COMPONENT16, GL_DEPTH_COMPONENT32F, GL_DEPTH24_STENCIL8 };
	const int			  internalformat_list_count = sizeof(internalformat_list) / sizeof(internalformat_list[0]);
	const glw::GLenum	 target = GL_TEXTURE_2D_MULTISAMPLE; /* Test case uses GL_TEXTURE_2D_MULTISAMPLE target */
	const glw::GLsizei	width  = 1;

	/* Iterate through all internal formats test case should check */
	for (int internalformat_index = 0; internalformat_index < internalformat_list_count; internalformat_index++)
	{
		/* Iteration-specific internalformat */
		glw::GLenum internalformat = internalformat_list[internalformat_index];

		/* Iterate through all fixedsamplelocations test case should check */
		for (int fixedsamplelocations_index = 0; fixedsamplelocations_index < fixedsamplelocations_list_count;
			 fixedsamplelocations_index++)
		{
			/* Iteration-specific fixedsamplelocations */
			glw::GLboolean fixedsamplelocations = fixedsamplelocations_list[fixedsamplelocations_index];

			/* Initialize texture object and bind it to GL_TEXTURE_2D_MULTISAMPLE target */
			initInternalIteration();

			/* Get GL_MAX_SAMPLES value */
			gl.getIntegerv(GL_MAX_SAMPLES, &gl_max_samples_value);

			GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to retrieve GL_MAX_SAMPLES value");

			/* Get GL_MAX_DEPTH_TEXTURE_SAMPLES value */
			gl.getIntegerv(GL_MAX_DEPTH_TEXTURE_SAMPLES, &gl_max_depth_texture_samples_value);

			GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to retrieve GL_MAX_DEPTH_TEXTURE_SAMPLES value");

			/* Retrieve maximum amount of samples available for the texture target considered */
			gl.getInternalformativ(target, internalformat, GL_SAMPLES, 1, &gl_max_internalformat_samples_value);

			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetInternalformativ() failed to retrieve GL_SAMPLES");

			/* Issue call with valid parameters, but samples argument might be invalid */
			gl.texStorage2DMultisample(target, gl_max_internalformat_samples_value + 1, internalformat, width, height,
									   fixedsamplelocations);

			/* Expect GL_INVALID_OPERATION error code. */
			TCU_CHECK_MSG(gl.getError() == GL_INVALID_OPERATION,
						  "glTexStorage2DMultisample() did not generate GL_INVALID_OPERATION error.");

			/* Deinitialize texture object and unbind texture object bound to GL_TEXTURE_2D_MULTISAMPLE target */
			deinitInternalIteration();
		}
	}

	/* Test case passed */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}